

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase393::run(TestCase393 *this)

{
  StringPtr name;
  StructSchema results;
  ArrayPtr<const_char> local_90;
  DebugExpression<bool> _kjCondition;
  bool local_58;
  InterfaceSchema schema;
  SchemaLoader loader;
  
  local_90.size_ = (size_t)local_90.ptr;
  SchemaLoader::SchemaLoader(&loader);
  results.super_Schema.raw = (Schema)((long)schemas::s_d9d44ddacab3edbe + 0x48);
  Schema::getProto((Reader *)&_kjCondition,&results.super_Schema);
  local_90.ptr = (char *)SchemaLoader::load(&loader,(Reader *)&_kjCondition);
  schema = Schema::asInterface((Schema *)&local_90);
  name.content.size_ = 10;
  name.content.ptr = "doStreamI";
  InterfaceSchema::getMethodByName((Method *)&_kjCondition,&schema,name);
  results = InterfaceSchema::Method::getResultType((Method *)&_kjCondition);
  _kjCondition.value = StructSchema::isStreamResult(&results);
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.value) {
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,400,ERROR,"\"failed: expected \" \"results.isStreamResult()\", _kjCondition",
               (char (*) [42])"failed: expected results.isStreamResult()",&_kjCondition);
  }
  local_90 = (ArrayPtr<const_char>)Schema::getShortDisplayName(&results.super_Schema);
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_const_char_(&)[13]> *)&_kjCondition,
             (DebugExpression<kj::StringPtr> *)&local_90,(char (*) [13])"StreamResult");
  if ((local_58 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_90 = (ArrayPtr<const_char>)Schema::getShortDisplayName(&results.super_Schema);
    kj::_::Debug::
    log<char_const(&)[65],kj::_::DebugComparison<kj::StringPtr,char_const(&)[13]>&,kj::StringPtr>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x191,ERROR,
               "\"failed: expected \" \"results.getShortDisplayName() == \\\"StreamResult\\\"\", _kjCondition, results.getShortDisplayName()"
               ,(char (*) [65])"failed: expected results.getShortDisplayName() == \"StreamResult\"",
               (DebugComparison<kj::StringPtr,_const_char_(&)[13]> *)&_kjCondition,
               (StringPtr *)&local_90);
  }
  SchemaLoader::~SchemaLoader(&loader);
  return;
}

Assistant:

TEST(SchemaLoader, LoadStreaming) {
  SchemaLoader loader;

  InterfaceSchema schema =
      loader.load(Schema::from<test::TestStreaming>().getProto()).asInterface();

  auto results = schema.getMethodByName("doStreamI").getResultType();
  KJ_EXPECT(results.isStreamResult());
  KJ_EXPECT(results.getShortDisplayName() == "StreamResult", results.getShortDisplayName());
}